

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void GradientUnfilter_SSE2(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  uint8_t *unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_000000d4;
  uint8_t *in_stack_000000d8;
  uint8_t *in_stack_000000e0;
  uint8_t *in_stack_000000e8;
  
  if (in_RDI == (char *)0x0) {
    HorizontalUnfilter_SSE2
              ((uint8_t *)CONCAT44(width,in_stack_00000008),unaff_retaddr,(uint8_t *)0x0,
               (int)((ulong)in_RSI >> 0x20));
  }
  else {
    *in_RDX = *in_RSI + *in_RDI;
    GradientPredictInverse_SSE2
              (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
  }
  return;
}

Assistant:

static void GradientUnfilter_SSE2(const uint8_t* prev, const uint8_t* in,
                                  uint8_t* out, int width) {
  if (prev == NULL) {
    HorizontalUnfilter_SSE2(NULL, in, out, width);
  } else {
    out[0] = (uint8_t)(in[0] + prev[0]);  // predict from above
    GradientPredictInverse_SSE2(in + 1, prev + 1, out + 1, width - 1);
  }
}